

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<unsigned_long>
               (uint length,unsigned_long value1,unsigned_long value2,bool allowTrash)

{
  _func_int ***ppp_Var1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined1 auVar10 [16];
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  unsigned_long *puVar25;
  undefined1 (*pauVar26) [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var27;
  undefined8 *puVar28;
  long *plVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  long *plVar33;
  long *plVar34;
  int iVar35;
  ulong uVar36;
  undefined4 uVar37;
  _Atomic_word _Var39;
  undefined1 auVar38 [16];
  long lStack_b0;
  undefined1 (*local_a8) [16];
  shared_ptr<unsigned_long> pv1;
  shared_ptr<unsigned_long> pv2;
  shared_ptr<unsigned_long> presult;
  
  puVar25 = sse::common::malloc<unsigned_long>(length);
  std::__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2> *)&local_a8,puVar25,
             sse::common::free<unsigned_long>);
  puVar25 = sse::common::malloc<unsigned_long>(length);
  std::__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar25,
             sse::common::free<unsigned_long>);
  puVar25 = sse::common::malloc<unsigned_long>(length + 1);
  std::__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar25,
             sse::common::free<unsigned_long>);
  uVar36 = (ulong)length;
  (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar36] = (_func_int **)0x7f;
  auVar38._8_4_ = (int)value1;
  auVar38._0_8_ = value1;
  auVar38._12_4_ = (int)(value1 >> 0x20);
  iVar35 = (int)length >> 1;
  pauVar26 = local_a8;
  for (iVar31 = iVar35; 3 < iVar31; iVar31 = iVar31 + -4) {
    *pauVar26 = auVar38;
    pauVar26[1] = auVar38;
    pauVar26[2] = auVar38;
    pauVar26[3] = auVar38;
    pauVar26 = pauVar26 + 4;
  }
  if (1 < iVar31) {
    *pauVar26 = auVar38;
    pauVar26[1] = auVar38;
    iVar31 = iVar31 + -2;
    pauVar26 = pauVar26 + 2;
  }
  if (iVar31 != 0) {
    *pauVar26 = auVar38;
  }
  presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)length;
  if (length != 0) {
    *(unsigned_long *)
     (local_a8[-1] +
     (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
     8 + 8) = value1;
  }
  uVar37 = (undefined4)value2;
  _Var39 = (_Atomic_word)(value2 >> 0x20);
  _Var27 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  for (iVar31 = iVar35; 3 < iVar31; iVar31 = iVar31 + -4) {
    _Var3._M_use_count = uVar37;
    _Var3._vptr__Sp_counted_base = (_func_int **)value2;
    _Var3._M_weak_count = _Var39;
    *_Var27._M_pi = _Var3;
    _Var4._M_use_count = uVar37;
    _Var4._vptr__Sp_counted_base = (_func_int **)value2;
    _Var4._M_weak_count = _Var39;
    _Var27._M_pi[1] = _Var4;
    _Var5._M_use_count = uVar37;
    _Var5._vptr__Sp_counted_base = (_func_int **)value2;
    _Var5._M_weak_count = _Var39;
    _Var27._M_pi[2] = _Var5;
    _Var6._M_use_count = uVar37;
    _Var6._vptr__Sp_counted_base = (_func_int **)value2;
    _Var6._M_weak_count = _Var39;
    _Var27._M_pi[3] = _Var6;
    _Var27._M_pi = _Var27._M_pi + 4;
  }
  if (1 < iVar31) {
    _Var7._M_use_count = uVar37;
    _Var7._vptr__Sp_counted_base = (_func_int **)value2;
    _Var7._M_weak_count = _Var39;
    *_Var27._M_pi = _Var7;
    _Var8._M_use_count = uVar37;
    _Var8._vptr__Sp_counted_base = (_func_int **)value2;
    _Var8._M_weak_count = _Var39;
    _Var27._M_pi[1] = _Var8;
    iVar31 = iVar31 + -2;
    _Var27._M_pi = _Var27._M_pi + 2;
  }
  if (iVar31 != 0) {
    _Var9._M_use_count = uVar37;
    _Var9._vptr__Sp_counted_base = (_func_int **)value2;
    _Var9._M_weak_count = _Var39;
    *_Var27._M_pi = _Var9;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
     8 + -8) = value2;
  }
  uVar30 = 0;
  while (uVar36 != uVar30) {
    if ((*(unsigned_long *)(*local_a8 + uVar30 * 8) != value1) ||
       (ppp_Var1 = &(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + uVar30, uVar30 = uVar30 + 1,
       *ppp_Var1 != (_func_int **)value2)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x1a;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  lVar32 = 0;
  for (iVar31 = iVar35; 3 < iVar31; iVar31 = iVar31 + -4) {
    plVar34 = (long *)((long)&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    lVar11 = plVar34[1];
    plVar29 = (long *)((long)&pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar32);
    lVar12 = *plVar29;
    lVar13 = plVar29[1];
    plVar29 = (long *)((long)&pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    lVar14 = *plVar29;
    lVar15 = plVar29[1];
    plVar29 = (long *)((long)&pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar32);
    lVar16 = *plVar29;
    lVar17 = plVar29[1];
    lVar18 = *(long *)((long)(*local_a8 + lVar32) + 8);
    lVar19 = *(long *)(local_a8[1] + lVar32);
    lVar20 = *(long *)((long)(local_a8[1] + lVar32) + 8);
    lVar21 = *(long *)(local_a8[2] + lVar32);
    lVar22 = *(long *)((long)(local_a8[2] + lVar32) + 8);
    lVar23 = *(long *)(local_a8[3] + lVar32);
    lVar24 = *(long *)((long)(local_a8[3] + lVar32) + 8);
    plVar29 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    *plVar29 = *plVar34 + *(long *)(*local_a8 + lVar32);
    plVar29[1] = lVar11 + lVar18;
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar32);
    *plVar34 = lVar12 + lVar19;
    plVar34[1] = lVar13 + lVar20;
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    *plVar34 = lVar14 + lVar21;
    plVar34[1] = lVar15 + lVar22;
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar32);
    *plVar34 = lVar16 + lVar23;
    plVar34[1] = lVar17 + lVar24;
    lVar32 = lVar32 + 0x40;
  }
  if (iVar31 < 2) {
    plVar34 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    plVar29 = (long *)((long)&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    plVar33 = (long *)(*local_a8 + lVar32);
  }
  else {
    plVar2 = (long *)((long)&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    plVar29 = plVar2 + 4;
    lVar11 = plVar2[1];
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    plVar33 = (long *)(local_a8[2] + lVar32);
    lVar32 = plVar33[-3];
    plVar34[-4] = *plVar2 + plVar33[-4];
    plVar34[-3] = lVar11 + lVar32;
    lVar32 = plVar2[3];
    lVar11 = plVar33[-1];
    plVar34[-2] = plVar2[2] + plVar33[-2];
    plVar34[-1] = lVar32 + lVar11;
    iVar31 = iVar31 + -2;
  }
  if (iVar31 != 0) {
    lVar32 = plVar29[1];
    lVar11 = plVar33[1];
    *plVar34 = *plVar29 + *plVar33;
    plVar34[1] = lVar32 + lVar11;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi +
             (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi * 8 + -8) =
         *(long *)((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi +
                  (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi * 8 + -8) +
         *(long *)(local_a8[-1] +
                  (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi * 8 + 8);
  }
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 + value1)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x22;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  lVar32 = 0;
  for (iVar31 = iVar35; 3 < iVar31; iVar31 = iVar31 + -4) {
    lVar11 = *(long *)((long)(*local_a8 + lVar32) + 8);
    lVar12 = *(long *)(local_a8[1] + lVar32);
    lVar13 = *(long *)((long)(local_a8[1] + lVar32) + 8);
    lVar14 = *(long *)(local_a8[2] + lVar32);
    lVar15 = *(long *)((long)(local_a8[2] + lVar32) + 8);
    lVar16 = *(long *)(local_a8[3] + lVar32);
    lVar17 = *(long *)((long)(local_a8[3] + lVar32) + 8);
    plVar34 = (long *)((long)&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    lVar18 = plVar34[1];
    plVar29 = (long *)((long)&pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar32);
    lVar19 = *plVar29;
    lVar20 = plVar29[1];
    plVar29 = (long *)((long)&pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    lVar21 = *plVar29;
    lVar22 = plVar29[1];
    plVar29 = (long *)((long)&pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar32);
    lVar23 = *plVar29;
    lVar24 = plVar29[1];
    plVar29 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    *plVar29 = *(long *)(*local_a8 + lVar32) - *plVar34;
    plVar29[1] = lVar11 - lVar18;
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar32);
    *plVar34 = lVar12 - lVar19;
    plVar34[1] = lVar13 - lVar20;
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    *plVar34 = lVar14 - lVar21;
    plVar34[1] = lVar15 - lVar22;
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar32);
    *plVar34 = lVar16 - lVar23;
    plVar34[1] = lVar17 - lVar24;
    lVar32 = lVar32 + 0x40;
  }
  if (iVar31 < 2) {
    plVar34 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    plVar29 = (long *)((long)&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    plVar33 = (long *)(*local_a8 + lVar32);
  }
  else {
    plVar2 = (long *)((long)&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    plVar29 = plVar2 + 4;
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    plVar33 = (long *)(local_a8[2] + lVar32);
    lVar32 = plVar33[-3];
    lVar11 = plVar2[1];
    plVar34[-4] = plVar33[-4] - *plVar2;
    plVar34[-3] = lVar32 - lVar11;
    lVar32 = plVar33[-1];
    lVar11 = plVar2[3];
    plVar34[-2] = plVar33[-2] - plVar2[2];
    plVar34[-1] = lVar32 - lVar11;
    iVar31 = iVar31 + -2;
  }
  if (iVar31 != 0) {
    lVar32 = plVar33[1];
    lVar11 = plVar29[1];
    *plVar34 = *plVar33 - *plVar29;
    plVar34[1] = lVar32 - lVar11;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi +
             (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi * 8 + -8) =
         *(long *)(local_a8[-1] +
                  (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi * 8 + 8) -
         *(long *)((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi +
                  (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi * 8 + -8);
  }
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 - value2)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x2a;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  auVar10._8_4_ = uVar37;
  auVar10._0_8_ = value2;
  auVar10._12_4_ = _Var39;
  nosimd::arithmetic::mul<unsigned_long>
            ((unsigned_long *)local_a8,
             (unsigned_long *)
             pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (unsigned_long *)
             pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 * value1)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x32;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<unsigned_long>
            ((unsigned_long *)local_a8,
             (unsigned_long *)
             pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (unsigned_long *)
             pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  lStack_b0 = auVar10._8_8_;
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 / value2)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x3a;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  lVar32 = 0;
  for (iVar31 = iVar35; 3 < iVar31; iVar31 = iVar31 + -4) {
    lVar11 = *(long *)((long)(*local_a8 + lVar32) + 8);
    plVar34 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(*local_a8 + lVar32) + value2;
    plVar34[1] = lVar11 + lStack_b0;
    lVar11 = *(long *)((long)(local_a8[1] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(local_a8[1] + lVar32) + value2;
    plVar34[1] = lVar11 + lStack_b0;
    lVar11 = *(long *)((long)(local_a8[2] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(local_a8[2] + lVar32) + value2;
    plVar34[1] = lVar11 + lStack_b0;
    lVar11 = *(long *)((long)(local_a8[3] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(local_a8[3] + lVar32) + value2;
    plVar34[1] = lVar11 + lStack_b0;
    lVar32 = lVar32 + 0x40;
  }
  if (iVar31 < 2) {
    plVar34 = (long *)(*local_a8 + lVar32);
    plVar29 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
  }
  else {
    plVar33 = (long *)(*local_a8 + lVar32);
    plVar34 = plVar33 + 4;
    lVar11 = plVar33[1];
    plVar29 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    plVar29[-4] = *plVar33 + value2;
    plVar29[-3] = lVar11 + lStack_b0;
    lVar32 = plVar33[3];
    plVar29[-2] = plVar33[2] + value2;
    plVar29[-1] = lVar32 + lStack_b0;
    iVar31 = iVar31 + -2;
  }
  if (iVar31 != 0) {
    lVar32 = plVar34[1];
    *plVar29 = *plVar34 + value2;
    plVar29[1] = lVar32 + lStack_b0;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
     8 + -8) = *(long *)(local_a8[-1] +
                        (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi * 8 + 8) + value2;
  }
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 + value1)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x43;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  lVar32 = 0;
  for (iVar31 = iVar35; 3 < iVar31; iVar31 = iVar31 + -4) {
    lVar11 = *(long *)((long)(*local_a8 + lVar32) + 8);
    plVar34 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(*local_a8 + lVar32) - value2;
    plVar34[1] = lVar11 - lStack_b0;
    lVar11 = *(long *)((long)(local_a8[1] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(local_a8[1] + lVar32) - value2;
    plVar34[1] = lVar11 - lStack_b0;
    lVar11 = *(long *)((long)(local_a8[2] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(local_a8[2] + lVar32) - value2;
    plVar34[1] = lVar11 - lStack_b0;
    lVar11 = *(long *)((long)(local_a8[3] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar32);
    *plVar34 = *(long *)(local_a8[3] + lVar32) - value2;
    plVar34[1] = lVar11 - lStack_b0;
    lVar32 = lVar32 + 0x40;
  }
  if (iVar31 < 2) {
    plVar34 = (long *)(*local_a8 + lVar32);
    plVar29 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
  }
  else {
    plVar33 = (long *)(*local_a8 + lVar32);
    plVar34 = plVar33 + 4;
    lVar11 = plVar33[1];
    plVar29 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    plVar29[-4] = *plVar33 - value2;
    plVar29[-3] = lVar11 - lStack_b0;
    lVar32 = plVar33[3];
    plVar29[-2] = plVar33[2] - value2;
    plVar29[-1] = lVar32 - lStack_b0;
    iVar31 = iVar31 + -2;
  }
  if (iVar31 != 0) {
    lVar32 = plVar34[1];
    *plVar29 = *plVar34 - value2;
    plVar29[1] = lVar32 - lStack_b0;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
     8 + -8) = *(long *)(local_a8[-1] +
                        (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi * 8 + 8) - value2;
  }
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 - value2)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x4b;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  lVar32 = 0;
  for (; 3 < iVar35; iVar35 = iVar35 + -4) {
    lVar11 = *(long *)((long)(*local_a8 + lVar32) + 8);
    plVar34 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
    *plVar34 = value2 - *(long *)(*local_a8 + lVar32);
    plVar34[1] = lStack_b0 - lVar11;
    lVar11 = *(long *)((long)(local_a8[1] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar32);
    *plVar34 = value2 - *(long *)(local_a8[1] + lVar32);
    plVar34[1] = lStack_b0 - lVar11;
    lVar11 = *(long *)((long)(local_a8[2] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    *plVar34 = value2 - *(long *)(local_a8[2] + lVar32);
    plVar34[1] = lStack_b0 - lVar11;
    lVar11 = *(long *)((long)(local_a8[3] + lVar32) + 8);
    plVar34 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar32);
    *plVar34 = value2 - *(long *)(local_a8[3] + lVar32);
    plVar34[1] = lStack_b0 - lVar11;
    lVar32 = lVar32 + 0x40;
  }
  if (iVar35 < 2) {
    plVar34 = (long *)(*local_a8 + lVar32);
    plVar29 = (long *)((long)&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar32);
  }
  else {
    plVar33 = (long *)(*local_a8 + lVar32);
    plVar34 = plVar33 + 4;
    lVar11 = plVar33[1];
    plVar29 = (long *)((long)&pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar32);
    plVar29[-4] = value2 - *plVar33;
    plVar29[-3] = lStack_b0 - lVar11;
    lVar32 = plVar33[3];
    plVar29[-2] = value2 - plVar33[2];
    plVar29[-1] = lStack_b0 - lVar32;
    iVar35 = iVar35 + -2;
  }
  if (iVar35 != 0) {
    lVar32 = plVar34[1];
    *plVar29 = value2 - *plVar34;
    plVar29[1] = lStack_b0 - lVar32;
  }
  if (length != 0) {
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     (long)presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
     8 + -8) = value2 - *(long *)(local_a8[-1] +
                                 (long)presult.
                                       super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi * 8 + 8);
  }
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 - value1)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x53;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mulC<unsigned_long>
            ((unsigned_long *)local_a8,value2,
             (unsigned_long *)
             pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 * value1)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x5b;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<unsigned_long>
            ((unsigned_long *)local_a8,value2,
             (unsigned_long *)
             pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 / value2)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 99;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<unsigned_long>
            ((unsigned_long *)local_a8,value2,
             (unsigned_long *)
             pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar30 = 0;
  while (uVar36 != uVar30) {
    ppp_Var1 = &(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base + uVar30;
    uVar30 = uVar30 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 / value1)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar28 + 1) = 0x6b;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) &&
     ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar36] != (_func_int **)0x7f)) {
    puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
    *(undefined4 *)(puVar28 + 1) = 0x70;
    *(uint *)((long)puVar28 + 0xc) = length;
    __cxa_throw(puVar28,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}